

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackframe.cpp
# Opt level: O0

void __thiscall
stackjit::StackWalker::visitReferences
          (StackWalker *this,StackFrame *stackFrame,VisitReferenceFn *fn,VisitFrameFn *frameFn)

{
  ManagedFunction *function;
  VisitReferenceFn *stackFrame_00;
  bool bVar1;
  ExecutionEngine *pEVar2;
  CallStack *pCVar3;
  CallStackEntry *pCVar4;
  RegisterValue *currentBasePtr;
  function<void_(stackjit::StackFrameEntry)> local_c8;
  undefined1 local_a8 [8];
  StackFrame callStackFrame;
  RegisterValue *callBasePtr;
  int callPoint;
  ManagedFunction *topFunc;
  CallStackEntry callEntry;
  CallStackEntry *pCStack_60;
  int topFuncIndex;
  CallStackEntry *topEntryPtr;
  function<void_(stackjit::StackFrameEntry)> local_48;
  VisitFrameFn *local_28;
  VisitFrameFn *frameFn_local;
  VisitReferenceFn *fn_local;
  StackFrame *stackFrame_local;
  StackWalker *this_local;
  
  local_28 = frameFn;
  frameFn_local = (VisitFrameFn *)fn;
  fn_local = (VisitReferenceFn *)stackFrame;
  stackFrame_local = (StackFrame *)this;
  bVar1 = std::function::operator_cast_to_bool((function *)frameFn);
  if (bVar1) {
    std::function<void_(const_stackjit::StackFrame_&)>::operator()(frameFn,(StackFrame *)fn_local);
  }
  stackFrame_00 = fn_local;
  std::function<void_(stackjit::StackFrameEntry)>::function(&local_48,fn);
  visitReferencesInFrame(this,(StackFrame *)stackFrame_00,&local_48);
  std::function<void_(stackjit::StackFrameEntry)>::~function(&local_48);
  pEVar2 = VMState::engine(this->mVMState);
  pCVar3 = ExecutionEngine::callStack(pEVar2);
  pCStack_60 = CallStack::top(pCVar3);
  callEntry._12_4_ = 0;
  while( true ) {
    pEVar2 = VMState::engine(this->mVMState);
    pCVar3 = ExecutionEngine::callStack(pEVar2);
    pCVar4 = CallStack::start(pCVar3);
    if (pCStack_60 <= pCVar4) break;
    function = pCStack_60->function;
    callEntry.function._0_4_ = (int)*(undefined8 *)&pCStack_60->callPoint;
    currentBasePtr = StackFrame::basePtr((StackFrame *)fn_local);
    callStackFrame._16_8_ = findBasePtr(this,currentBasePtr,0,callEntry._12_4_);
    StackFrame::StackFrame
              ((StackFrame *)local_a8,(RegisterValue *)callStackFrame._16_8_,function,
               (int)callEntry.function);
    bVar1 = std::function::operator_cast_to_bool((function *)frameFn);
    if (bVar1) {
      std::function<void_(const_stackjit::StackFrame_&)>::operator()(frameFn,(StackFrame *)local_a8)
      ;
    }
    std::function<void_(stackjit::StackFrameEntry)>::function(&local_c8,fn);
    visitReferencesInFrame(this,(StackFrame *)local_a8,&local_c8);
    std::function<void_(stackjit::StackFrameEntry)>::~function(&local_c8);
    pCStack_60 = pCStack_60 + -1;
    callEntry._12_4_ = callEntry._12_4_ + 1;
  }
  return;
}

Assistant:

void StackWalker::visitReferences(const StackFrame& stackFrame,	VisitReferenceFn fn, VisitFrameFn frameFn) {
		if (frameFn) {
			frameFn(stackFrame);
		}

		//Visit the calling stack frame
		visitReferencesInFrame(stackFrame, fn);

		//Then all other stack frames
		auto topEntryPtr = mVMState.engine().callStack().top();
		int topFuncIndex = 0;
		while (topEntryPtr > mVMState.engine().callStack().start()) {
			auto callEntry = *topEntryPtr;
			auto topFunc = callEntry.function;
			auto callPoint = callEntry.callPoint;
			auto callBasePtr = findBasePtr(stackFrame.basePtr(), 0, topFuncIndex);

			StackFrame callStackFrame(callBasePtr, topFunc, callPoint);
			if (frameFn) {
				frameFn(callStackFrame);
			}

			visitReferencesInFrame(callStackFrame, fn);

			topEntryPtr--;
			topFuncIndex++;
		}
	}